

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O0

int Gia_ManVerifyCex(Gia_Man_t *pAig,Abc_Cex_t *p,int fDualOut)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int local_48;
  int local_44;
  int iBit;
  int k;
  int i;
  int RetValue;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  int fDualOut_local;
  Abc_Cex_t *p_local;
  Gia_Man_t *pAig_local;
  
  local_48 = 0;
  Gia_ManCleanMark0(pAig);
  iBit = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(pAig);
    bVar7 = false;
    if (iBit < iVar3) {
      iVar3 = Gia_ManPiNum(pAig);
      pObjRi = Gia_ManCi(pAig,iVar3 + iBit);
      bVar7 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_48);
    *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
    iBit = iBit + 1;
    local_48 = local_48 + 1;
  }
  for (iBit = 0; iBit <= p->iFrame; iBit = iBit + 1) {
    local_44 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(pAig);
      bVar7 = false;
      if (local_44 < iVar3) {
        pObjRi = Gia_ManCi(pAig,local_44);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_48);
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      local_44 = local_44 + 1;
      local_48 = local_48 + 1;
    }
    local_44 = 0;
    while( true ) {
      bVar7 = false;
      if (local_44 < pAig->nObjs) {
        pObjRi = Gia_ManObj(pAig,local_44);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar3 = Gia_ObjIsAnd(pObjRi);
      if (iVar3 != 0) {
        pGVar6 = Gia_ObjFanin0(pObjRi);
        uVar2 = *(ulong *)pGVar6;
        uVar5 = Gia_ObjFaninC0(pObjRi);
        pGVar6 = Gia_ObjFanin1(pObjRi);
        uVar1 = *(ulong *)pGVar6;
        uVar4 = Gia_ObjFaninC1(pObjRi);
        *(ulong *)pObjRi =
             *(ulong *)pObjRi & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1
             ) << 0x1e;
      }
      local_44 = local_44 + 1;
    }
    local_44 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(pAig->vCos);
      bVar7 = false;
      if (local_44 < iVar3) {
        pObjRi = Gia_ManCo(pAig,local_44);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(pObjRi);
      uVar2 = *(ulong *)pGVar6;
      uVar5 = Gia_ObjFaninC0(pObjRi);
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      local_44 = local_44 + 1;
    }
    if (iBit == p->iFrame) break;
    local_44 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(pAig);
      bVar7 = false;
      if (local_44 < iVar3) {
        iVar3 = Gia_ManPoNum(pAig);
        pObjRo = Gia_ManCo(pAig,iVar3 + local_44);
        bVar7 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(pAig);
          _i = Gia_ManCi(pAig,iVar3 + local_44);
          bVar7 = _i != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar7) break;
      *(ulong *)_i = *(ulong *)_i & 0xffffffffbfffffff |
                     (ulong)((uint)(*(ulong *)pObjRo >> 0x1e) & 1) << 0x1e;
      local_44 = local_44 + 1;
    }
  }
  if (local_48 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCex.c"
                  ,0x47,"int Gia_ManVerifyCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (fDualOut == 0) {
    pGVar6 = Gia_ManPo(pAig,p->iPo);
    k = (uint)(*(ulong *)pGVar6 >> 0x1e) & 1;
  }
  else {
    pGVar6 = Gia_ManPo(pAig,p->iPo << 1);
    uVar2 = *(ulong *)pGVar6;
    pGVar6 = Gia_ManPo(pAig,p->iPo * 2 + 1);
    k = (uint)(uVar2 >> 0x1e) & 1 ^ (uint)(*(ulong *)pGVar6 >> 0x1e) & 1;
  }
  Gia_ManCleanMark0(pAig);
  return k;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Resimulates the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManVerifyCex( Gia_Man_t * pAig, Abc_Cex_t * p, int fDualOut )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
        }
    }
    assert( iBit == p->nBits );
    if ( fDualOut )
        RetValue = Gia_ManPo(pAig, 2*p->iPo)->fMark0 ^ Gia_ManPo(pAig, 2*p->iPo+1)->fMark0;
    else
        RetValue = Gia_ManPo(pAig, p->iPo)->fMark0;
    Gia_ManCleanMark0(pAig);
    return RetValue;
}